

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

void FOOLElimination::buildApplication
               (uint symbol,Context context,TermStack *vars,TermList *functionApplication,
               Formula **predicateApplication)

{
  Term *pTVar1;
  AtomicFormula *this;
  Literal *lit;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,context) == 0) {
    this = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    lit = Kernel::Literal::create
                    (symbol,(uint)((ulong)((long)vars->_cursor - (long)vars->_stack) >> 3),true,
                     vars->_stack);
    Kernel::AtomicFormula::AtomicFormula(this,lit);
    *predicateApplication = (Formula *)this;
  }
  else {
    pTVar1 = Kernel::Term::create
                       (symbol,(uint)((ulong)((long)vars->_cursor - (long)vars->_stack) >> 3),
                        vars->_stack);
    functionApplication->_content = (uint64_t)pTVar1;
  }
  return;
}

Assistant:

void FOOLElimination::buildApplication(unsigned symbol, Context context, TermStack& vars,
                                       TermList& functionApplication, Formula*& predicateApplication) {
  if (context == FORMULA_CONTEXT) {
    predicateApplication = new AtomicFormula(Literal::create(symbol, vars.size(), true, vars.begin()));
  } else {
    functionApplication = TermList(Term::create(symbol, vars.size(), vars.begin()));
  }
}